

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O0

double ExprEval::Operator::trigger(size_t index,double *args)

{
  size_t extraout_XMM0_Qa;
  double result;
  double *args_local;
  size_t index_local;
  
  if (index == 0) {
    index_local = (size_t)_add(args,2);
  }
  else if (index == 1) {
    index_local = (size_t)_subtract(args,2);
  }
  else if (index == 2) {
    index_local = (size_t)_multiply(args,2);
  }
  else if (index == 3) {
    index_local = (size_t)_divide(args,2);
  }
  else if (index == 4) {
    index_local = (size_t)_pow(args,2);
  }
  else if (index == 5) {
    index_local = (size_t)_mod(args,2);
  }
  else if (index == 6) {
    index_local = (size_t)_ln(args,2);
  }
  else if (index == 7) {
    index_local = (size_t)_log2(args,2);
  }
  else if (index == 8) {
    index_local = (size_t)_log10(args,2);
  }
  else if (index == 9) {
    index_local = (size_t)_sin(args,1);
  }
  else if (index == 10) {
    index_local = (size_t)_cos(args,1);
  }
  else if (index == 0xb) {
    index_local = (size_t)_tan(args,1);
  }
  else if (index == 0xc) {
    index_local = (size_t)_cot(args,1);
  }
  else if (index == 0xd) {
    index_local = (size_t)_sinh(args,1);
  }
  else if (index == 0xe) {
    index_local = (size_t)_cosh(args,1);
  }
  else if (index == 0xf) {
    index_local = (size_t)_tanh(args,1);
  }
  else if (index == 0x10) {
    index_local = (size_t)_arcsin(args,1);
  }
  else if (index == 0x11) {
    index_local = (size_t)_arccos(args,1);
  }
  else if (index == 0x12) {
    index_local = (size_t)_arctan(args,1);
  }
  else if (index == 0x13) {
    index_local = (size_t)_arcsinh(args,1);
  }
  else if (index == 0x14) {
    index_local = (size_t)_arccosh(args,1);
  }
  else if (index == 0x15) {
    index_local = (size_t)_arctanh(args,1);
  }
  else if (index == 0x16) {
    index_local = (size_t)_round(args,1);
  }
  else if (index == 0x17) {
    index_local = (size_t)_floor(args,1);
  }
  else if (index == 0x18) {
    index_local = (size_t)_ceil(args,1);
  }
  else if (index == 0x19) {
    _abs((int)args);
    index_local = extraout_XMM0_Qa;
  }
  else if (index == 0x1a) {
    index_local = (size_t)_gamma(0.0);
  }
  else if (index == 0x1b) {
    index_local = (size_t)_rand(args,1);
  }
  else if (index == 0x1c) {
    index_local = (size_t)_pi(args,0);
  }
  else if (index == 0x1d) {
    index_local = (size_t)_e(args,0);
  }
  else if (index == 0x1e) {
    index_local = (size_t)_true(args,0);
  }
  else if (index == 0x1f) {
    index_local = (size_t)_false(args,0);
  }
  else if (index == 0x20) {
    index_local = (size_t)_and(args,2);
  }
  else if (index == 0x21) {
    index_local = (size_t)_or(args,2);
  }
  else if (index == 0x22) {
    index_local = (size_t)_not(args,1);
  }
  else if (index == 0x23) {
    index_local = (size_t)_xor(args,2);
  }
  else if (index == 0x24) {
    index_local = (size_t)_shiftl(args,2);
  }
  else if (index == 0x25) {
    index_local = (size_t)_shiftr(args,2);
  }
  else {
    index_local = 0;
  }
  return (double)index_local;
}

Assistant:

double trigger(size_t index, double* args){
            double result = 0.0;

            if(index == 0){
                return _add(args);
            } else if(index == 1){
                return _subtract(args);
            } else if(index == 2){
                return _multiply(args);
            } else if(index == 3){
                return _divide(args);
            } else if(index == 4){
                return _pow(args);
            } else if(index == 5){
                return _mod(args);
            } else if(index == 6){
                return _ln(args);
            } else if(index == 7){
                return _log2(args);
            } else if(index == 8){
                return _log10(args);
            } else if(index == 9){
                return _sin(args);
            } else if(index == 10){
                return _cos(args);
            } else if(index == 11){
                return _tan(args);
            } else if(index == 12){
                return _cot(args);
            } else if(index == 13){
                return _sinh(args);
            } else if(index == 14){
                return _cosh(args);
            } else if(index == 15){
                return _tanh(args);
            } else if(index == 16){
                return _arcsin(args);
            } else if(index == 17){
                return _arccos(args);
            } else if(index == 18){
                return _arctan(args);
            } else if(index == 19){
                return _arcsinh(args);
            } else if(index == 20){
                return _arccosh(args);
            } else if(index == 21){
                return _arctanh(args);
            } else if(index == 22){
                return _round(args);
            } else if(index == 23){
                return _floor(args);
            } else if(index == 24){
                return _ceil(args);
            } else if(index == 25){
                return _abs(args);
            } else if(index == 26){
                return _gamma(args);
            } else if(index == 27){
                return _rand(args);
            } else if(index == 28){ // Adding a constant
                return _pi(args);
            } else if(index == 29){ // Adding a constant
                return _e(args);
            } else if(index == 30){ // Adding a constant
                return _true(args);
            } else if(index == 31){ // Adding a constant
                return _false(args);
            } else if(index == 32){
                return _and(args);
            } else if(index == 33){
                return _or(args);
            } else if(index == 34){
                return _not(args);
            } else if(index == 35){
                return _xor(args);
            } else if(index == 36){
                return _shiftl(args);
            } else if(index == 37){
                return _shiftr(args);
            }

            return result;
        }